

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedColorMasks.cpp
# Opt level: O2

bool __thiscall
glcts::DrawBuffersIndexedColorMasks::VerifyImg
          (DrawBuffersIndexedColorMasks *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  ostringstream *this_00;
  int iVar1;
  bool bVar2;
  int z;
  int y;
  RGBA a;
  IVec4 color;
  undefined1 local_1c8 [24];
  undefined1 local_1b0 [384];
  
  z = 0;
  local_1c8._16_8_ = this;
  do {
    iVar1 = (textureLevel->m_size).m_data[1];
    if (iVar1 <= z) {
LAB_00ccf8c2:
      return iVar1 <= z;
    }
    for (y = 0; y < (textureLevel->m_size).m_data[0]; y = y + 1) {
      tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,textureLevel);
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_1c8,(int)(ConstPixelBufferAccess *)local_1b0,y,z);
      a.m_value = local_1c8._4_4_ << 8 | local_1c8._0_4_ |
                  local_1c8._8_4_ << 0x10 | local_1c8._12_4_ << 0x18;
      bVar2 = tcu::compareThreshold(a,expectedColor,epsilon);
      if (!bVar2) {
        local_1b0._0_8_ =
             ((((DrawBuffersIndexedBase *)local_1c8._16_8_)->super_TestCaseBase).super_TestCase.
              super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Expected value: ");
        tcu::operator<<((ostream *)this_00,expectedColor);
        std::operator<<((ostream *)this_00,"\n");
        std::operator<<((ostream *)this_00,"Read value:     ");
        tcu::operator<<((ostream *)this_00,a);
        std::operator<<((ostream *)this_00,"\n");
        std::operator<<((ostream *)this_00,"Epsilon:        ");
        tcu::operator<<((ostream *)this_00,epsilon);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        goto LAB_00ccf8c2;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

bool DrawBuffersIndexedColorMasks::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
											 tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::IVec4 color(textureLevel.getAccess().getPixelInt(x, y));
			tcu::RGBA  pixel(color.x(), color.y(), color.z(), color.w());

			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}